

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryTestCase.cpp
# Opt level: O1

void __thiscall
SuiteDataDictionaryTests::TestaddFieldValue::~TestaddFieldValue(TestaddFieldValue *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(addFieldValue)
{
  DataDictionary object;
  CHECK( !object.isFieldValue( 12, "f" ) );
  CHECK( !object.isFieldValue( 12, "g" ) );
  CHECK( !object.isFieldValue( 15, "1" ) );
  CHECK( !object.isFieldValue( 18, "2" ) );
  CHECK( !object.isFieldValue( 167, "FUT" ) );

  object.addFieldValue( 12, "f" );
  object.addFieldValue( 12, "g" );
  object.addFieldValue( 15, "1" );
  object.addFieldValue( 18, "2" );
  object.addFieldValue( 167, "FUT" );

  CHECK( object.isFieldValue( 12, "f" ) );
  CHECK( object.isFieldValue( 12, "g" ) );
  CHECK( object.isFieldValue( 15, "1" ) );
  CHECK( object.isFieldValue( 18, "2" ) );
  CHECK( object.isFieldValue( 167, "FUT" ) );
}